

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
OperatorBracket<phmap::parallel_node_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(OperatorBracket<phmap::parallel_node_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  slot_type ptVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int *piVar4;
  long lVar5;
  int *piVar6;
  pointer *__ptr;
  char *pcVar7;
  AssertionResult gtest_ar;
  vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> values;
  TypeParam m;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_528;
  internal local_520 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_518;
  AssertHelper local_510;
  int *local_508;
  int *piStack_500;
  long local_4f8;
  undefined8 uStack_4f0;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
  local_4e8;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_4b0;
  
  local_508 = (int *)0x0;
  piStack_500 = (int *)0x0;
  local_4f8 = 0;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>,int,phmap::priv::hash_internal::Generator<std::pair<int_const,int>,void>>
            ();
  piVar4 = piStack_500;
  lVar5 = 0x40;
  do {
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar5 + -0x30) = 0;
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar5 + -0x28) = 0;
    *(undefined8 *)((long)&uStack_4f0 + lVar5) = 0;
    *(undefined8 *)((long)&local_4e8.first.inner_ + lVar5) = 0;
    *(undefined8 *)((long)local_4b0.sets_._M_elems + lVar5 + -0x18) = 0;
    *(long *)((long)local_4b0.sets_._M_elems + lVar5 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_4b0.sets_._M_elems + lVar5 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_4b0.sets_._M_elems[0].set_.ctrl_ + lVar5) = 0;
    lVar5 = lVar5 + 0x48;
  } while (lVar5 != 0x4c0);
  if (local_508 != piStack_500) {
    piVar6 = local_508;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)*piVar6;
      parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
      ::try_emplace_impl_with_hash<int_const&>
                (&local_4e8,
                 (parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
                  *)&local_4b0,
                 SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),piVar6);
      ptVar1 = *local_4e8.first.it_.field_1.slot_;
      local_4e8.first.inner_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                (local_520,"V()","val",(int *)&local_4e8,&ptVar1->second);
      if (local_520[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_528);
        testing::PrintToString<int>((string *)&local_4e8,piVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_528._M_head_impl + 0x10),
                   (char *)CONCAT44(local_4e8.first.inner_._4_4_,local_4e8.first.inner_._0_4_),
                   (long)local_4e8.first.inner_end_);
        pcVar7 = "";
        if (local_518 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = (local_518->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_510,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x3c,pcVar7);
        testing::internal::AssertHelper::operator=(&local_510,(Message *)&local_528);
        testing::internal::AssertHelper::~AssertHelper(&local_510);
        if ((EmbeddedIterator *)CONCAT44(local_4e8.first.inner_._4_4_,local_4e8.first.inner_._0_4_)
            != &local_4e8.first.it_) {
          operator_delete((undefined1 *)
                          CONCAT44(local_4e8.first.inner_._4_4_,local_4e8.first.inner_._0_4_),
                          (ulong)(local_4e8.first.it_.ctrl_ + 1));
        }
        if (local_528._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_528._M_head_impl + 8))();
        }
      }
      if (local_518 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_518,local_518);
      }
      ptVar1->second = piVar6[1];
      piVar6 = piVar6 + 2;
    } while (piVar6 != piVar4);
  }
  piVar4 = piStack_500;
  if (local_508 != piStack_500) {
    piVar6 = local_508;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)*piVar6;
      parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
      ::try_emplace_impl_with_hash<int_const&>
                (&local_4e8,
                 (parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
                  *)&local_4b0,
                 SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0),piVar6);
      testing::internal::CmpHelperEQ<int,int>
                (local_520,"p.second","m[p.first]",piVar6 + 1,
                 &(*local_4e8.first.it_.field_1.slot_)->second);
      if (local_520[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_528);
        testing::PrintToString<int>((string *)&local_4e8,piVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_528._M_head_impl + 0x10),
                   (char *)CONCAT44(local_4e8.first.inner_._4_4_,local_4e8.first.inner_._0_4_),
                   (long)local_4e8.first.inner_end_);
        pcVar7 = "";
        if (local_518 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = (local_518->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_510,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x40,pcVar7);
        testing::internal::AssertHelper::operator=(&local_510,(Message *)&local_528);
        testing::internal::AssertHelper::~AssertHelper(&local_510);
        if ((EmbeddedIterator *)CONCAT44(local_4e8.first.inner_._4_4_,local_4e8.first.inner_._0_4_)
            != &local_4e8.first.it_) {
          operator_delete((undefined1 *)
                          CONCAT44(local_4e8.first.inner_._4_4_,local_4e8.first.inner_._0_4_),
                          (ulong)(local_4e8.first.it_.ctrl_ + 1));
        }
        if (local_528._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_528._M_head_impl + 8))();
        }
      }
      if (local_518 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_518,local_518);
      }
      piVar6 = piVar6 + 2;
    } while (piVar6 != piVar4);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_4b0);
  if (local_508 != (int *)0x0) {
    operator_delete(local_508,local_4f8 - (long)local_508);
  }
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, EqualRange) {
  using std::get;
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(0, std::distance(r.first, r.second));
  }
  m.insert(values.begin(), values.end());
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(1, std::distance(r.first, r.second));
    EXPECT_EQ(p.second, get<1>(*r.first)) << ::testing::PrintToString(p.first);
  }
}